

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

int Gia_ManRealizeFormula_rec(Gia_Man_t *p,int *pVars,int *pPars,char *pBeg,char *pEnd,int nPars)

{
  char cVar1;
  int iCtrl;
  int iData1;
  int iData0;
  char *pcVar2;
  char *pEnd_00;
  char *pEndNew;
  int Oper;
  int iFans [3];
  int nPars_local;
  char *pEnd_local;
  char *pBeg_local;
  int *pPars_local;
  int *pVars_local;
  Gia_Man_t *p_local;
  
  if (pBeg + 1 == pEnd) {
    if ((*pBeg < 'a') || ('b' < *pBeg)) {
      if ((*pBeg < 'A') || ('B' < *pBeg)) {
        if ((*pBeg < 'p') || ('w' < *pBeg)) {
          if ((*pBeg < 'P') || ('W' < *pBeg)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x31d,
                          "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                         );
          }
          p_local._4_4_ = Abc_LitNot(pPars[*pBeg + -0x50]);
        }
        else {
          p_local._4_4_ = pPars[*pBeg + -0x70];
        }
      }
      else {
        p_local._4_4_ = Abc_LitNot(pVars[*pBeg + -0x41]);
      }
    }
    else {
      p_local._4_4_ = pVars[*pBeg + -0x61];
    }
  }
  else if ((*pBeg == '(') && (pcVar2 = Gia_ManFormulaEndToken(pBeg), pcVar2 == pEnd)) {
    if (*pBeg != '(') {
      __assert_fail("pBeg[0] == \'(\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x325,
                    "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)")
      ;
    }
    if (pEnd[-1] != ')') {
      __assert_fail("pBeg[pEnd-pBeg-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x326,
                    "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)")
      ;
    }
    p_local._4_4_ = Gia_ManRealizeFormula_rec(p,pVars,pPars,pBeg + 1,pEnd + -1,nPars);
  }
  else {
    pcVar2 = Gia_ManFormulaEndToken(pBeg);
    iCtrl = Gia_ManRealizeFormula_rec(p,pVars,pPars,pBeg,pcVar2,nPars);
    cVar1 = *pcVar2;
    pEnd_00 = Gia_ManFormulaEndToken(pcVar2 + 1);
    iData1 = Gia_ManRealizeFormula_rec(p,pVars,pPars,pcVar2 + 1,pEnd_00,nPars);
    if (cVar1 == '&') {
      p_local._4_4_ = Gia_ManHashAnd(p,iCtrl,iData1);
    }
    else if (cVar1 == '|') {
      p_local._4_4_ = Gia_ManHashOr(p,iCtrl,iData1);
    }
    else if (cVar1 == '^') {
      p_local._4_4_ = Gia_ManHashXor(p,iCtrl,iData1);
    }
    else {
      if (cVar1 != '?') {
        __assert_fail("Oper == \'?\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x33a,
                      "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                     );
      }
      if (*pEnd_00 != ':') {
        __assert_fail("pEndNew[0] == \':\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x33b,
                      "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                     );
      }
      pcVar2 = Gia_ManFormulaEndToken(pEnd_00 + 1);
      iData0 = Gia_ManRealizeFormula_rec(p,pVars,pPars,pEnd_00 + 1,pcVar2,nPars);
      p_local._4_4_ = Gia_ManHashMux(p,iCtrl,iData1,iData0);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManRealizeFormula_rec( Gia_Man_t * p, int * pVars, int * pPars, char * pBeg, char * pEnd, int nPars )
{
    int iFans[3], Oper = -1;
    char * pEndNew;
    if ( pBeg + 1 == pEnd )
    {
        if ( pBeg[0] >= 'a' && pBeg[0] <= 'b' )
            return pVars[pBeg[0] - 'a'];
        if ( pBeg[0] >= 'A' && pBeg[0] <= 'B' )
            return Abc_LitNot( pVars[pBeg[0] - 'A'] );
        if ( pBeg[0] >= 'p' && pBeg[0] <= 'w' ) // pqrstuvw
            return pPars[pBeg[0] - 'p'];
        if ( pBeg[0] >= 'P' && pBeg[0] <= 'W' )
            return Abc_LitNot( pPars[pBeg[0] - 'P'] );
        assert( 0 );
        return -1;
    }
    if ( pBeg[0] == '(' )
    {
        pEndNew = Gia_ManFormulaEndToken( pBeg );
        if ( pEndNew == pEnd )
        {
            assert( pBeg[0] == '(' );
            assert( pBeg[pEnd-pBeg-1] == ')' );
            return Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg + 1, pEnd - 1, nPars );
        }
    }
    // get first part
    pEndNew  = Gia_ManFormulaEndToken( pBeg );
    iFans[0] = Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg, pEndNew, nPars );
    Oper     = pEndNew[0];
    // get second part
    pBeg     = pEndNew + 1;
    pEndNew  = Gia_ManFormulaEndToken( pBeg );
    iFans[1] = Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg, pEndNew, nPars );
    // derive the formula
    if ( Oper == '&' )
        return Gia_ManHashAnd( p, iFans[0], iFans[1] );
    if ( Oper == '|' )
        return Gia_ManHashOr( p, iFans[0], iFans[1] );
    if ( Oper == '^' )
        return Gia_ManHashXor( p, iFans[0], iFans[1] );
    // get third part
    assert( Oper == '?' );
    assert( pEndNew[0] == ':' );
    pBeg     = pEndNew + 1;
    pEndNew  = Gia_ManFormulaEndToken( pBeg );
    iFans[2] = Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg, pEndNew, nPars );
    return Gia_ManHashMux( p, iFans[0], iFans[1], iFans[2] );
}